

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_units.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  Surface *pSVar2;
  undefined4 extraout_var;
  undefined1 local_50 [8];
  SDLBackend backend;
  
  rengine::SDLBackend::SDLBackend((SDLBackend *)local_50);
  pSVar2 = (Surface *)operator_new(0x10);
  pSVar2->_vptr_Surface = (_func_int **)&PTR__Surface_0011bcf8;
  iVar1 = (*rengine::Backend::m_singleton->_vptr_Backend[3])(rengine::Backend::m_singleton,pSVar2);
  pSVar2->m_impl = (SurfaceBackendImpl *)CONCAT44(extraout_var,iVar1);
  surface = pSVar2;
  tst_dpi();
  local_50 = (undefined1  [8])&PTR__SDLBackend_0011baf0;
  backend.super_Backend._8_8_ = &DAT_0011bb70;
  SDL_Quit();
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
    RENGINE_BACKEND backend;
    surface = new Surface();

    tst_dpi();

    return 0;
}